

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItemPrivate::sortChildren
          (QTreeWidgetItemPrivate *this,int column,SortOrder order,bool climb)

{
  bool bVar1;
  QTreeModel *pQVar2;
  iterator o;
  undefined1 in_CL;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QList<QTreeWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  QTreeModel *model;
  SortOrder in_stack_00000020;
  undefined3 in_stack_00000024;
  iterator it;
  QTreeWidget *in_stack_ffffffffffffffc8;
  QTreeWidgetItem *in_stack_ffffffffffffffd0;
  SortOrder in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffdc;
  uint column_00;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  column_00 = CONCAT13(in_CL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  pQVar2 = QTreeWidgetItem::treeModel(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if ((pQVar2 != (QTreeModel *)0x0) &&
     (QTreeModel::sortItems
                ((QTreeModel *)this,(QList<QTreeWidgetItem_*> *)CONCAT44(column,order),
                 _in_stack_00000024,in_stack_00000020), (column_00 & 0x1000000) != 0)) {
    local_10.i = (QTreeWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QTreeWidgetItem_*>::begin(in_RDI);
    while( true ) {
      o = QList<QTreeWidgetItem_*>::end(in_RDI);
      bVar1 = QList<QTreeWidgetItem_*>::iterator::operator!=(&local_10,o);
      if (!bVar1) break;
      QList<QTreeWidgetItem_*>::iterator::operator*(&local_10);
      sortChildren((QTreeWidgetItemPrivate *)CONCAT44(in_ESI,in_EDX),column_00,
                   in_stack_ffffffffffffffd8,SUB81((ulong)pQVar2 >> 0x38,0));
      QList<QTreeWidgetItem_*>::iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItemPrivate::sortChildren(int column, Qt::SortOrder order, bool climb)
{
    QTreeModel *model = q->treeModel();
    if (!model)
        return;
    model->sortItems(&q->children, column, order);
    if (climb) {
        QList<QTreeWidgetItem*>::iterator it = q->children.begin();
        for (; it != q->children.end(); ++it) {
            //here we call the private object's method to avoid emitting
            //the layoutAboutToBeChanged and layoutChanged signals
            (*it)->d->sortChildren(column, order, climb);
        }
    }
}